

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profile-table.cc
# Opt level: O3

void __thiscall HeapProfileTable::MarkAsIgnored(HeapProfileTable *this,void *ptr)

{
  long *plVar1;
  
  plVar1 = (long *)((ulong)((uint)((int)((ulong)ptr >> 0x14) * -0x61c88647) >> 0x11 & 0xfffffff8) +
                   (long)this->address_map_->hashtable_);
  do {
    plVar1 = (long *)*plVar1;
    if (plVar1 == (long *)0x0) {
      return;
    }
  } while (plVar1[1] != (ulong)ptr >> 0x14);
  plVar1 = (long *)((long)plVar1 + (ulong)((uint)((ulong)ptr >> 4) & 0xfff8) + 0x10);
  do {
    plVar1 = (long *)*plVar1;
    if (plVar1 == (long *)0x0) {
      return;
    }
  } while ((void *)plVar1[1] != ptr);
  *(byte *)(plVar1 + 3) = *(byte *)(plVar1 + 3) | 2;
  return;
}

Assistant:

void HeapProfileTable::MarkAsIgnored(const void* ptr) {
  AllocValue* alloc = address_map_->FindMutable(ptr);
  if (alloc) {
    alloc->set_ignore(true);
  }
}